

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_test.cpp
# Opt level: O3

void __thiscall skip_this_test::test_method(skip_this_test *this)

{
  long *plVar1;
  undefined8 uVar2;
  shared_count sStack_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  undefined **local_30;
  undefined1 local_28;
  undefined8 *local_20;
  char **local_18;
  
  plVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  uVar2 = boost::unit_test::framework::current_test_case();
  local_40 = "This test is ignored";
  local_38 = "";
  (**(code **)(*plVar1 + 0x28))(plVar1,uVar2);
  local_50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/zaufi[P]teamcity-cpp/boost/boost_test.cpp"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x7a);
  sStack_88.pi_ = (sp_counted_base *)0x0;
  local_18 = &local_70;
  local_70 = "true";
  local_68 = "";
  local_28 = 0;
  local_30 = &PTR__lazy_ostream_00118608;
  local_20 = &boost::unit_test::lazy_ostream::inst;
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/zaufi[P]teamcity-cpp/boost/boost_test.cpp"
  ;
  local_78 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_88);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(skip_this_test)
{
    boost::unit_test::unit_test_log.test_unit_skipped(
        boost::unit_test_framework::framework::current_test_case()
#if BOOST_VERSION >= 105900
      , "This test is ignored"
#endif                                                      // BOOST_VERSION >= 105900
      );
    BOOST_CHECK(true);
}